

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O3

Hsh_IntMan_t * Sdm_ManBuildHashTable(Vec_Int_t **pvConfgRes)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  void *__ptr;
  Vec_Int_t *__ptr_00;
  int *__ptr_01;
  FILE *__stream;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Hsh_IntMan_t *p;
  Vec_Int_t *pVVar9;
  Vec_Wrd_t *p_00;
  word *pwVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  size_t __n;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  
  iVar4 = Extra_FileSize("dsdfuncs6.dat");
  iVar2 = iVar4 >> 0x1f;
  iVar11 = iVar4 / 0xc + iVar2;
  uVar12 = iVar11 - iVar2;
  uVar15 = (iVar11 - iVar2) - 1;
  uVar16 = 0x10;
  if (0xe < uVar15) {
    uVar16 = uVar12;
  }
  lVar17 = (long)(int)uVar16;
  if (uVar16 == 0) {
    __ptr_00 = (Vec_Int_t *)malloc(0x10);
    __ptr_00->nSize = 0;
    __ptr_00->nCap = 0;
    __ptr = (void *)0x0;
    __ptr_01 = (int *)0x0;
  }
  else {
    __ptr = malloc(lVar17 * 8);
    __ptr_00 = (Vec_Int_t *)malloc(0x10);
    __ptr_00->nSize = 0;
    __ptr_00->nCap = uVar16;
    __ptr_01 = (int *)malloc(lVar17 * 4);
  }
  __ptr_00->pArray = __ptr_01;
  __stream = fopen("dsdfuncs6.dat","rb");
  __n = (size_t)(int)uVar12;
  fread(__ptr,8,__n,__stream);
  fread(__ptr_01,4,__n,__stream);
  __ptr_00->nSize = uVar12;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < uVar12 * 2 - 1) {
    iVar11 = uVar12 * 2;
  }
  pVVar7->nCap = iVar11;
  if (iVar11 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar7->pArray = piVar8;
  memcpy(piVar8,__ptr,__n << 3);
  pVVar7->nSize = uVar12 * 2;
  p = (Hsh_IntMan_t *)calloc(1,0x20);
  p->nSize = 2;
  p->vData = pVVar7;
  while( true ) {
    do {
      uVar6 = uVar15;
      uVar15 = uVar6 + 1;
    } while ((uVar6 & 1) != 0);
    if (uVar15 < 9) break;
    iVar11 = 5;
    while (uVar15 % (iVar11 - 2U) != 0) {
      uVar5 = iVar11 * iVar11;
      iVar11 = iVar11 + 2;
      if (uVar15 < uVar5) goto LAB_00484a5e;
    }
  }
LAB_00484a5e:
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  uVar5 = 0x10;
  if (0xe < uVar6) {
    uVar5 = uVar15;
  }
  pVVar9->nCap = uVar5;
  piVar8 = (int *)malloc((long)(int)uVar5 << 2);
  pVVar9->pArray = piVar8;
  pVVar9->nSize = uVar15;
  if (piVar8 != (int *)0x0) {
    memset(piVar8,0xff,(long)(int)uVar15 << 2);
  }
  p->vTable = pVVar9;
  p_00 = (Vec_Wrd_t *)malloc(0x10);
  uVar15 = 0;
  p_00->nSize = 0;
  p_00->nCap = uVar16;
  if (uVar16 == 0) {
    pwVar10 = (word *)0x0;
  }
  else {
    pwVar10 = (word *)malloc(lVar17 << 3);
  }
  p_00->pArray = pwVar10;
  p->vObjs = p_00;
  if (0xb < iVar4) {
    uVar14 = 0;
    do {
      if (pVVar9->nSize < p_00->nSize) {
        uVar18 = (ulong)(pVVar9->nSize * 2 - 1);
        while( true ) {
          do {
            uVar15 = (uint)uVar18;
            uVar16 = uVar15 + 1;
            uVar19 = (ulong)uVar16;
            uVar1 = uVar18 & 1;
            uVar18 = uVar19;
          } while (uVar1 != 0);
          if (uVar16 < 9) break;
          iVar11 = 5;
          while (uVar16 % (iVar11 - 2U) != 0) {
            uVar6 = iVar11 * iVar11;
            iVar11 = iVar11 + 2;
            if (uVar16 < uVar6) goto LAB_00484b47;
          }
        }
LAB_00484b47:
        if (pVVar9->nCap < (int)uVar16) {
          if (pVVar9->pArray == (int *)0x0) {
            piVar8 = (int *)malloc((long)(int)uVar16 << 2);
          }
          else {
            piVar8 = (int *)realloc(pVVar9->pArray,(long)(int)uVar16 << 2);
          }
          pVVar9->pArray = piVar8;
          if (piVar8 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar9->nCap = uVar16;
        }
        if (uVar15 < 0x7fffffff) {
          memset(pVVar9->pArray,0xff,uVar19 << 2);
        }
        pVVar9->nSize = uVar16;
        if (0 < p_00->nSize) {
          pwVar10 = p_00->pArray;
          lVar17 = 0;
          do {
            iVar11 = (int)pwVar10[lVar17];
            if ((iVar11 < 0) || (uVar15 = iVar11 * 2, pVVar7->nSize <= (int)uVar15))
            goto LAB_00484d18;
            lVar13 = 0;
            uVar16 = 0;
            do {
              lVar3 = lVar13 + (ulong)uVar15 * 4;
              lVar13 = lVar13 + 1;
              uVar16 = (*(byte *)((long)pVVar7->pArray + lVar3) + uVar16) * 0x401;
              uVar16 = uVar16 >> 6 ^ uVar16;
            } while (lVar13 != 8);
            uVar18 = (ulong)((uVar16 * 9 >> 0xb ^ uVar16 * 9) * 0x8001) % (ulong)(uint)pVVar9->nSize
            ;
            if (((int)uVar18 < 0) || (pVVar9->nSize <= (int)uVar18)) goto LAB_00484d18;
            piVar8 = pVVar9->pArray;
            *(int *)((long)pwVar10 + lVar17 * 8 + 4) = piVar8[uVar18];
            piVar8[uVar18] = (int)lVar17;
            lVar17 = lVar17 + 1;
          } while (lVar17 < p_00->nSize);
        }
      }
      if (pVVar7->nSize <= (int)uVar14 * 2) {
LAB_00484d18:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar8 = Hsh_IntManLookup(p,(uint *)(pVVar7->pArray + uVar14 * 2));
      iVar11 = *piVar8;
      if (iVar11 == -1) {
        *piVar8 = p_00->nSize;
        Vec_WrdPush(p_00,uVar14 | 0xffffffff00000000);
      }
      else if ((iVar11 < 0) || (p_00->nSize <= iVar11)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar12);
    uVar15 = p_00->nSize;
  }
  if (uVar15 != uVar12) {
    __assert_fail("Vec_WrdSize(p->vObjs) == nEntries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                  ,0x18a,"Hsh_IntMan_t *Hsh_WrdManHashArrayStart(Vec_Wrd_t *, int)");
  }
  if (pvConfgRes == (Vec_Int_t **)0x0) {
    if (__ptr_01 != (int *)0x0) {
      free(__ptr_01);
    }
    free(__ptr_00);
  }
  else {
    *pvConfgRes = __ptr_00;
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return p;
}

Assistant:

Hsh_IntMan_t * Sdm_ManBuildHashTable( Vec_Int_t ** pvConfgRes ) 
{
    FILE * pFile;
    char * pFileName = "dsdfuncs6.dat";
    int RetValue, size = Extra_FileSize( pFileName ) / 12;  // 2866420
    Vec_Wrd_t * vTruthRes = Vec_WrdAlloc( size );
    Vec_Int_t * vConfgRes = Vec_IntAlloc( size );
    Hsh_IntMan_t * pHash;

    pFile = fopen( pFileName, "rb" );
    RetValue = fread( Vec_WrdArray(vTruthRes), sizeof(word), size, pFile );
    RetValue = fread( Vec_IntArray(vConfgRes), sizeof(int), size, pFile );
    vTruthRes->nSize = size;
    vConfgRes->nSize = size;
    // create hash table
    pHash = Hsh_WrdManHashArrayStart( vTruthRes, 1 );
    // cleanup
    if ( pvConfgRes )
        *pvConfgRes = vConfgRes;
    else
        Vec_IntFree( vConfgRes );
    Vec_WrdFree( vTruthRes );
//    Hsh_IntManStop( pHash );
    return pHash;
}